

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemLauncher.cpp
# Opt level: O1

string * __thiscall
ApprovalTests::SystemLauncher::getWindowsCommandLine
          (string *__return_storage_ptr__,SystemLauncher *this,string *commandLine,bool foreground)

{
  long lVar1;
  long *plVar2;
  undefined7 in_register_00000009;
  long *plVar3;
  size_type *psVar4;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if ((int)CONCAT71(in_register_00000009,foreground) == 0) {
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,"start \"\" ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     commandLine);
  }
  else {
    local_38[0] = local_28;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"cmd /S /C ","");
    plVar2 = (long *)::std::__cxx11::string::append((char *)local_38);
    local_78 = &local_68;
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_68 = *plVar3;
      lStack_60 = plVar2[3];
    }
    else {
      local_68 = *plVar3;
      local_78 = (long *)*plVar2;
    }
    local_70 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_78,(ulong)(commandLine->_M_dataplus)._M_p);
    local_58 = &local_48;
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_48 = *plVar3;
      lStack_40 = plVar2[3];
    }
    else {
      local_48 = *plVar3;
      local_58 = (long *)*plVar2;
    }
    local_50 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)::std::__cxx11::string::append((char *)&local_58);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar4 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar4) {
      lVar1 = plVar2[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    }
    __return_storage_ptr__->_M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
  }
  if (foreground) {
    if (local_58 != &local_48) {
      operator_delete(local_58);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78);
    }
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemLauncher::getWindowsCommandLine(const std::string& commandLine,
                                                      bool foreground) const
    {
        std::string launch = foreground
                                 ? (std::string("cmd /S /C ") + "\"" + commandLine + "\"")
                                 : ("start \"\" " + commandLine);

        return launch;
    }